

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O0

void QtSharedPointer::internalSafetyCheckAdd(void *d_ptr,void *ptr)

{
  Type *pTVar1;
  void *pvVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  void *other_d_ptr;
  KnownPointers *kp;
  Data data;
  QMutexLocker<QMutex> lock;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QHash<const_volatile_void_*,_const_void_*> *in_stack_ffffffffffffff48;
  QMessageLogger *in_stack_ffffffffffffff50;
  QMessageLogger local_50;
  undefined8 local_30;
  long local_28;
  long local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RSI;
  local_20 = in_RDI;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
           operator()(in_stack_ffffffffffffff38);
  if (pTVar1 != (Type *)0x0) {
    if (local_28 == 0) {
      local_28 = local_20;
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
               ,(QMutex *)in_stack_ffffffffffffff38);
    local_30 = 0;
    pvVar2 = QHash<const_volatile_void_*,_const_void_*>::value
                       (in_stack_ffffffffffffff48,
                        (void **)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (void **)in_stack_ffffffffffffff38);
    if (pvVar2 != (void *)0x0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38);
      QMessageLogger::fatal
                (&local_50,
                 "QSharedPointer: internal self-check failed: pointer %p was already tracked by another QSharedPointer object %p"
                 ,local_28,pvVar2);
    }
    QHash<const_void_*,_(anonymous_namespace)::Data>::insert
              ((QHash<const_void_*,_(anonymous_namespace)::Data> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (void **)in_stack_ffffffffffffff38,(Data *)0x62fc45);
    QHash<const_volatile_void_*,_const_void_*>::insert
              ((QHash<const_volatile_void_*,_const_void_*> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (void **)in_stack_ffffffffffffff38,(void **)0x62fc83);
    QMutexLocker<QMutex>::~QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtSharedPointer::internalSafetyCheckAdd(const void *d_ptr, const volatile void *ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    if (!ptr) {
        // nullptr is allowed to be tracked by more than one QSharedPointer, so we
        // need something else to put in our tracking structures
        ptr = d_ptr;
    }

    QMutexLocker lock(&kp->mutex);
    Q_ASSERT(!kp->dPointers.contains(d_ptr));

    //qDebug("Adding d=%p value=%p", d_ptr, ptr);

    const void *other_d_ptr = kp->dataPointers.value(ptr, nullptr);
    if (Q_UNLIKELY(other_d_ptr)) {
#  ifdef BACKTRACE_SUPPORTED
        printBacktrace(knownPointers()->dPointers.value(other_d_ptr).backtrace);
#  endif
        qFatal("QSharedPointer: internal self-check failed: pointer %p was already tracked "
               "by another QSharedPointer object %p", ptr, other_d_ptr);
    }

    Data data;
    data.pointer = ptr;
#  ifdef BACKTRACE_SUPPORTED
    data.backtrace = saveBacktrace();
#  endif

    kp->dPointers.insert(d_ptr, data);
    kp->dataPointers.insert(ptr, d_ptr);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}